

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

bool __thiscall FxSwitchStatement::CheckReturn(FxSwitchStatement *this)

{
  uint uVar1;
  FxExpression **ppFVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  
  uVar1 = (this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Count;
  uVar4 = (ulong)uVar1;
  if (uVar4 != 0) {
    ppFVar2 = (this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Array;
    lVar5 = 0;
    do {
      if (*(int *)(*(long *)((long)ppFVar2 + lVar5) + 0x24) == 0x32) {
        return false;
      }
      lVar5 = lVar5 + 8;
    } while (uVar4 * 8 - lVar5 != 0);
    if (uVar4 != 0) {
      iVar3 = (*ppFVar2[uVar1 - 1]->_vptr_FxExpression[7])();
      return SUB41(iVar3,0);
    }
  }
  return false;
}

Assistant:

iterator end()
	{
		return &Array[Count];
	}